

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O0

lzma_ret lzma_block_encoder_init
                   (lzma_next_coder_conflict11 *next,lzma_allocator *allocator,lzma_block *block)

{
  lzma_bool lVar1;
  lzma_coder_conflict12 *plVar2;
  lzma_block *block_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict11 *next_local;
  
  if ((code *)next->init != lzma_block_encoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_block_encoder_init;
  if (block == (lzma_block *)0x0) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else if (block->version == 0) {
    if (block->check < 0x10) {
      lVar1 = lzma_check_is_supported(block->check);
      if (lVar1 == '\0') {
        next_local._4_4_ = LZMA_UNSUPPORTED_CHECK;
      }
      else {
        if (next->coder == (lzma_coder_conflict12 *)0x0) {
          plVar2 = (lzma_coder_conflict12 *)lzma_alloc(0xd0,allocator);
          next->coder = plVar2;
          if (next->coder == (lzma_coder_conflict12 *)0x0) {
            return LZMA_MEM_ERROR;
          }
          next->code = block_encode;
          next->end = block_encoder_end;
          next->update = block_encoder_update;
          memcpy(next->coder,&LZMA_NEXT_CODER_INIT,0x40);
        }
        next->coder->sequence = SEQ_CODE;
        next->coder->block = block;
        next->coder->compressed_size = 0;
        next->coder->uncompressed_size = 0;
        next->coder->pos = 0;
        lzma_check_init(&next->coder->check,block->check);
        next_local._4_4_ =
             lzma_raw_encoder_init((lzma_next_coder *)next->coder,allocator,block->filters);
      }
    }
    else {
      next_local._4_4_ = LZMA_PROG_ERROR;
    }
  }
  else {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_block_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_encoder_init, next, allocator);

	if (block == NULL)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version first.
	if (block->version != 0)
		return LZMA_OPTIONS_ERROR;

	// If the Check ID is not supported, we cannot calculate the check and
	// thus not create a proper Block.
	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Allocate and initialize *next->coder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &block_encode;
		next->end = &block_encoder_end;
		next->update = &block_encoder_update;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	next->coder->sequence = SEQ_CODE;
	next->coder->block = block;
	next->coder->compressed_size = 0;
	next->coder->uncompressed_size = 0;
	next->coder->pos = 0;

	// Initialize the check
	lzma_check_init(&next->coder->check, block->check);

	// Initialize the requested filters.
	return lzma_raw_encoder_init(&next->coder->next, allocator,
			block->filters);
}